

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<bool>
          (AsciiParser *this,char sep,char end_symbol,vector<bool,_std::allocator<bool>_> *result)

{
  StreamReader *pSVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  allocator *paVar5;
  char *pcVar6;
  bool value;
  allocator local_51;
  char c;
  
  (result->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p =
       (result->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_p;
  (result->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  bVar2 = SkipWhitespaceAndNewline(this,true);
  if (bVar2) {
    bVar2 = ReadBasicType(this,&value);
    if (bVar2) {
      ::std::vector<bool,_std::allocator<bool>_>::push_back(result,value);
      do {
        bVar2 = Eof(this);
        if (bVar2) goto LAB_00322902;
        bVar2 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar2) {
          return false;
        }
        bVar2 = Char1(this,&c);
        if (!bVar2) {
          return false;
        }
        if (c == sep) {
          bVar2 = SkipCommentAndWhitespaceAndNewline(this,true);
          if (!bVar2) {
            return false;
          }
          bVar2 = LookChar1(this,&value);
          if (!bVar2) {
            return false;
          }
          iVar3 = 3;
          if (value != (bool)end_symbol) goto LAB_00322868;
        }
        else {
LAB_00322868:
          if (c != sep) {
            pSVar1 = this->_sr;
            if ((0 < (long)pSVar1->idx_) && (uVar4 = pSVar1->idx_ - 1, uVar4 <= pSVar1->length_)) {
              pSVar1->idx_ = uVar4;
            }
            goto LAB_00322902;
          }
          bVar2 = SkipWhitespaceAndNewline(this,true);
          if (!bVar2) {
            return false;
          }
          bVar2 = ReadBasicType(this,&value);
          iVar3 = 3;
          if (bVar2) {
            ::std::vector<bool,_std::allocator<bool>_>::push_back(result,value);
            iVar3 = 0;
          }
        }
      } while (iVar3 == 0);
      if (iVar3 == 1) {
        return false;
      }
LAB_00322902:
      if ((result->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p !=
          (result->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p) {
        return true;
      }
      if ((result->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset != 0) {
        return true;
      }
      pcVar6 = "Empty array.\n";
      paVar5 = (allocator *)&value;
    }
    else {
      pcVar6 = "Not starting with the value of requested type.\n";
      paVar5 = &local_51;
    }
    ::std::__cxx11::string::string((string *)&c,pcVar6,paVar5);
    PushError(this,(string *)&c);
    ::std::__cxx11::string::_M_dispose();
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}